

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Robot.cpp
# Opt level: O0

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* bMatrix(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,double theta)

{
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_02;
  vector<double,_std::allocator<double>_> *local_170;
  allocator<std::vector<double,_std::allocator<double>_>_> local_11b;
  undefined1 local_11a;
  allocator<double> local_119;
  double local_118 [4];
  iterator local_f8;
  size_type local_f0;
  allocator<double> local_e1;
  double local_e0;
  double local_d8;
  undefined8 local_d0;
  iterator local_c8;
  size_type local_c0;
  allocator<double> local_a1;
  double local_a0;
  double local_98;
  undefined8 local_90;
  iterator local_88;
  size_type local_80;
  vector<double,_std::allocator<double>_> *local_78;
  vector<double,_std::allocator<double>_> local_70;
  vector<double,_std::allocator<double>_> local_58;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  double theta_local;
  
  local_11a = 1;
  local_78 = &local_70;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)theta;
  theta_local = (double)__return_storage_ptr__;
  local_a0 = cos(theta);
  local_98 = sin((double)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  local_98 = -local_98;
  local_90 = 0;
  local_88 = &local_a0;
  local_80 = 3;
  std::allocator<double>::allocator(&local_a1);
  __l_01._M_len = local_80;
  __l_01._M_array = local_88;
  std::vector<double,_std::allocator<double>_>::vector(&local_70,__l_01,&local_a1);
  local_78 = &local_58;
  local_e0 = sin((double)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  local_d8 = cos((double)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  local_d0 = 0;
  local_c8 = &local_e0;
  local_c0 = 3;
  std::allocator<double>::allocator(&local_e1);
  __l_00._M_len = local_c0;
  __l_00._M_array = local_c8;
  std::vector<double,_std::allocator<double>_>::vector(&local_58,__l_00,&local_e1);
  local_118[2] = 1.0;
  local_118[0] = 0.0;
  local_118[1] = 0.0;
  local_f8 = local_118;
  local_f0 = 3;
  local_78 = &local_40;
  std::allocator<double>::allocator(&local_119);
  __l._M_len = local_f0;
  __l._M_array = local_f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_40,__l,&local_119);
  local_11a = 0;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&local_70;
  local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x3;
  std::allocator<std::vector<double,_std::allocator<double>_>_>::allocator(&local_11b);
  __l_02._M_len =
       (size_type)
       local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  __l_02._M_array =
       (iterator)
       local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__l_02,&local_11b);
  std::allocator<std::vector<double,_std::allocator<double>_>_>::~allocator(&local_11b);
  local_170 = &local_28;
  do {
    local_170 = local_170 + -1;
    std::vector<double,_std::allocator<double>_>::~vector(local_170);
  } while (local_170 != &local_70);
  std::allocator<double>::~allocator(&local_119);
  std::allocator<double>::~allocator(&local_e1);
  std::allocator<double>::~allocator(&local_a1);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::vector<double> > bMatrix(double theta) {
    return {{std::cos(theta), -std::sin(theta), 0},
            {std::sin(theta), std::cos(theta), 0},
            {0, 0, 1}
    };
}